

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O0

void __thiscall Data<0U>::Data(Data<0U> *this)

{
  ostream *poVar1;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  es::init::singleton<es::init::std_init,_es::init::early_initializer,_void,_std::ios_base::Init>::
  instance();
  poVar1 = std::operator<<((ostream *)&std::cout,"Data::ctor ");
  poVar1 = std::operator<<(poVar1,"Data<0>::Data() [V = 0]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

Data()
    {
        es::init::singleton<es::init::std_init>::instance();
        //  [[ using gnu : used ]]
        //  static auto & init /* __attribute__((used)) */ {es::init::singleton<es::init::std_init>::instance()};

        std::cout << "Data::ctor " << __PRETTY_FUNCTION__ << std::endl;
    }